

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructPrim<tinyusdz::BlendShape>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,BlendShape *bs,
               string *warn,string *err,PrimReconstructOptions *options)

{
  size_type *psVar1;
  Attribute *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  string *psVar6;
  size_type sVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  ostream *poVar12;
  long *plVar13;
  bool *pbVar14;
  const_iterator cVar15;
  mapped_type *pmVar16;
  long *plVar17;
  _Base_ptr p_Var18;
  ulong uVar19;
  char *pcVar20;
  undefined8 uVar21;
  size_type __n;
  fmt fVar22;
  undefined8 this_00;
  _Base_ptr *pp_Var23;
  Property *pPVar24;
  Property *pPVar25;
  Property *pPVar26;
  byte bVar27;
  bool bVar28;
  bool bVar29;
  optional<std::vector<int,_std::allocator<int>_>_> pv;
  ParseResult ret;
  char *kPointIndices;
  char *kNormalOffsets;
  char *kOffsets;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  undefined7 in_stack_fffffffffffffc98;
  string local_360;
  pointer *local_340;
  vector<int,_std::allocator<int>_> local_338;
  undefined1 local_320 [8];
  _Alloc_hider local_318;
  undefined1 local_310 [24];
  string *local_2f8;
  bool *local_2f0;
  string local_2e8;
  Property *local_2c8;
  optional<std::vector<int,std::allocator<int>>> *local_2c0;
  AttrMetas *local_2b8;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_2b0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_2a8;
  bool *local_2a0;
  string *local_298;
  string *local_290;
  _Base_ptr local_288;
  long *local_280;
  ulong local_278;
  long local_270 [2];
  undefined1 local_260 [16];
  undefined1 local_250 [24];
  undefined8 local_238 [2];
  long *local_228 [2];
  long local_218 [2];
  long *local_208;
  Property *local_200;
  long local_1f8 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1a8 [6];
  ios_base local_148 [16];
  ios_base local_138 [264];
  
  local_250._0_8_ = "offsets";
  local_260._8_8_ = "normalOffsets";
  local_260._0_8_ = "pointIndices";
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1e8._M_impl.super__Rb_tree_header._M_header;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var18 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_288 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  bVar27 = p_Var18 == local_288;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (!(bool)bVar27) {
    local_290 = (string *)&bs->offsets;
    local_298 = (string *)&bs->normalOffsets;
    local_2b8 = &(bs->pointIndices)._metas;
    local_2b0 = &(bs->pointIndices)._paths;
    local_2c0 = (optional<std::vector<int,std::allocator<int>>> *)&(bs->pointIndices)._attrib;
    local_2f0 = &(bs->pointIndices)._blocked;
    local_2a0 = &(bs->pointIndices)._value_empty;
    local_2a8 = &bs->props;
    local_2f8 = err;
    do {
      local_228[0] = local_218;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_228,*(long *)(p_Var18 + 1),
                 (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
      this = (Attribute *)(p_Var18 + 2);
      local_1b8._0_8_ = local_1b8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"offsets","");
      pPVar26 = (Property *)local_1b8;
      (anonymous_namespace)::
      ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                ((ParseResult *)local_320,(_anonymous_namespace_ *)&local_1e8,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_228,(string *)this,(Property *)local_1b8,local_290,
                 (TypedAttribute<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
                  *)CONCAT17(bVar27,in_stack_fffffffffffffc98));
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,(ulong)(aaStack_1a8[0]._M_allocated_capacity + 1));
      }
      if (local_228[0] != local_218) {
        operator_delete(local_228[0],local_218[0] + 1);
      }
      iVar11 = 0;
      if (((ulong)local_320 & 0xfffffffd) == 0) {
        iVar11 = 3;
LAB_001f979e:
        bVar28 = false;
      }
      else {
        bVar28 = true;
        if (local_320._0_4_ != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,"ReconstructPrim",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
          poVar12 = (ostream *)::std::ostream::operator<<((Property *)local_1b8,0xbd2);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          local_340 = &local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_340,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char_const*,std::__cxx11::string>
                    (&local_360,(fmt *)&local_340,(string *)local_250,&local_318._M_p,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar26);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b8,local_360._M_dataplus._M_p,
                               local_360._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          paVar2 = &local_360.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_dataplus._M_p != paVar2) {
            operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
          }
          psVar6 = local_2f8;
          if (local_340 !=
              &local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish) {
            operator_delete(local_340,
                            (ulong)((long)&(((Attribute *)
                                            local_338.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_finish)->_name).
                                           _M_dataplus._M_p + 1));
          }
          if (psVar6 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar13 = (long *)::std::__cxx11::string::_M_append
                                        ((char *)&local_340,(ulong)(psVar6->_M_dataplus)._M_p);
            psVar1 = (size_type *)(plVar13 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar13 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_360.field_2._M_allocated_capacity = *psVar1;
              local_360.field_2._8_8_ = plVar13[3];
              local_360._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_360.field_2._M_allocated_capacity = *psVar1;
              local_360._M_dataplus._M_p = (pointer)*plVar13;
            }
            local_360._M_string_length = plVar13[1];
            *plVar13 = (long)psVar1;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)psVar6,(string *)&local_360);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p != paVar2) {
              operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_340 !=
                &local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
              operator_delete(local_340,
                              (ulong)((long)&(((Attribute *)
                                              local_338.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_finish)->_name)._M_dataplus
                                             ._M_p + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
          ::std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x70));
          iVar11 = 1;
          goto LAB_001f979e;
        }
      }
      if (local_318._M_p != local_310 + 8) {
        operator_delete(local_318._M_p,local_310._8_8_ + 1);
      }
      if (bVar28) {
        local_250._8_8_ = local_238;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_250 + 8),*(long *)(p_Var18 + 1),
                   (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
        local_1b8._0_8_ = local_1b8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"normalOffsets","");
        pPVar26 = (Property *)local_1b8;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                  ((ParseResult *)local_320,(_anonymous_namespace_ *)&local_1e8,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_250 + 8),(string *)this,(Property *)local_1b8,local_298,
                   (TypedAttribute<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
                    *)CONCAT17(bVar27,in_stack_fffffffffffffc98));
        if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
          operator_delete((void *)local_1b8._0_8_,(ulong)(aaStack_1a8[0]._M_allocated_capacity + 1))
          ;
        }
        if ((undefined8 *)local_250._8_8_ != local_238) {
          operator_delete((void *)local_250._8_8_,local_238[0] + 1);
        }
        iVar11 = 0;
        if (((ulong)local_320 & 0xfffffffd) == 0) {
          iVar11 = 3;
LAB_001f9aa1:
          bVar28 = false;
        }
        else {
          bVar28 = true;
          if (local_320._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
            poVar12 = (ostream *)::std::ostream::operator<<((Property *)local_1b8,0xbd3);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
            local_340 = &local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_340,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char_const*,std::__cxx11::string>
                      (&local_360,(fmt *)&local_340,(string *)(local_260 + 8),&local_318._M_p,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar26)
            ;
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b8,local_360._M_dataplus._M_p,
                                 local_360._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
            paVar2 = &local_360.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p != paVar2) {
              operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1
                             );
            }
            psVar6 = local_2f8;
            if (local_340 !=
                &local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
              operator_delete(local_340,
                              (ulong)((long)&(((Attribute *)
                                              local_338.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_finish)->_name)._M_dataplus
                                             ._M_p + 1));
            }
            if (psVar6 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar13 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)&local_340,(ulong)(psVar6->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar13 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar13 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_360.field_2._M_allocated_capacity = *psVar1;
                local_360.field_2._8_8_ = plVar13[3];
                local_360._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_360.field_2._M_allocated_capacity = *psVar1;
                local_360._M_dataplus._M_p = (pointer)*plVar13;
              }
              local_360._M_string_length = plVar13[1];
              *plVar13 = (long)psVar1;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)psVar6,(string *)&local_360);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_360._M_dataplus._M_p != paVar2) {
                operator_delete(local_360._M_dataplus._M_p,
                                local_360.field_2._M_allocated_capacity + 1);
              }
              if (local_340 !=
                  &local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
                operator_delete(local_340,
                                (ulong)((long)&(((Attribute *)
                                                local_338.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish)->_name).
                                               _M_dataplus._M_p + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            ::std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x70));
            iVar11 = 1;
            goto LAB_001f9aa1;
          }
        }
        if (local_318._M_p != local_310 + 8) {
          operator_delete(local_318._M_p,local_310._8_8_ + 1);
        }
        if (bVar28) {
          local_280 = local_270;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_280,*(long *)(p_Var18 + 1),
                     (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
          local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"pointIndices","");
          uVar19 = local_278;
          sVar7 = local_2e8._M_string_length;
          local_318._M_p = local_310 + 8;
          local_310._0_8_ = (char *)0x0;
          local_310._8_8_ = local_310._8_8_ & 0xffffffffffffff00;
          __n = local_278;
          if (local_2e8._M_string_length < local_278) {
            __n = local_2e8._M_string_length;
          }
          if (__n == 0) {
            bVar28 = true;
          }
          else {
            iVar11 = bcmp(local_280,local_2e8._M_dataplus._M_p,__n);
            bVar28 = iVar11 == 0;
          }
          if ((bool)(bVar28 ^ 1U | uVar19 != sVar7)) {
            local_320._0_4_ = 1;
          }
          else {
            Attribute::type_name_abi_cxx11_(&local_360,this);
            tinyusdz::value::TypeTraits<std::vector<int,std::allocator<int>>>::type_name_abi_cxx11_
                      ();
            if (local_1b8._8_8_ == local_360._M_string_length) {
              if ((Property *)local_1b8._8_8_ == (Property *)0x0) {
                bVar28 = true;
              }
              else {
                iVar11 = bcmp((void *)local_1b8._0_8_,local_360._M_dataplus._M_p,local_1b8._8_8_);
                bVar28 = iVar11 == 0;
              }
            }
            else {
              bVar28 = false;
            }
            bVar29 = true;
            if (!bVar28) {
              tinyusdz::value::TypeTraits<std::vector<int,std::allocator<int>>>::
              underlying_type_name_abi_cxx11_();
              if (local_200 == (Property *)local_360._M_string_length) {
                if (local_200 != (Property *)0x0) {
                  iVar11 = bcmp(local_208,local_360._M_dataplus._M_p,(size_t)local_200);
                  bVar29 = iVar11 == 0;
                }
              }
              else {
                bVar29 = false;
              }
            }
            if ((!bVar28) && (local_208 != local_1f8)) {
              operator_delete(local_208,local_1f8[0] + 1);
            }
            if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
              operator_delete((void *)local_1b8._0_8_,
                              (ulong)(aaStack_1a8[0]._M_allocated_capacity + 1));
            }
            if (bVar29) {
              p_Var4 = p_Var18[6]._M_parent;
              p_Var5 = p_Var18[6]._M_left;
              if (p_Var5 != p_Var4) {
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_2b0,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var18[6]._M_parent);
              }
              uVar3 = *(uint *)((long)&p_Var18[0x17]._M_parent + 4);
              uVar19 = (ulong)uVar3;
              pbVar14 = local_2a0;
              if (uVar3 == 0) {
LAB_001f9f8b:
                *pbVar14 = true;
                fVar22 = (fmt)0x1;
LAB_001f9f90:
                if ((p_Var5 == p_Var4 & ((byte)fVar22 ^ 1)) == 0) {
                  AttrMetas::operator=(local_2b8,(AttrMetas *)(p_Var18 + 7));
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&local_1e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_2e8);
                  local_320 = (undefined1  [8])((ulong)local_320 & 0xffffffff00000000);
                }
                else {
                  local_320._0_4_ = 8;
                  pPVar26 = (Property *)0x18;
                  pcVar20 = "Internal data corrupsed.";
LAB_001f9ff2:
                  ::std::__cxx11::string::_M_replace
                            ((ulong)&local_318,0,(char *)local_310._0_8_,(ulong)pcVar20);
                }
                goto LAB_001f9ffc;
              }
              if (uVar3 != 1) {
LAB_001f9f87:
                fVar22 = (fmt)0x0;
                goto LAB_001f9f90;
              }
              if (p_Var18[3]._M_color != _S_black) {
                local_320._0_4_ = 4;
                local_340 = &local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish;
                local_2c8 = (Property *)0x2d;
                local_340 = (pointer *)
                            ::std::__cxx11::string::_M_create((ulong *)&local_340,(ulong)&local_2c8)
                ;
                local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)local_2c8;
                *local_340 = (pointer)0x7475626972747441;
                local_340[1] = (pointer)0x6d20607d7b602065;
                pcVar20 = (char *)(local_340 + 2);
                pcVar20[0] = 'u';
                pcVar20[1] = 's';
                pcVar20[2] = 't';
                pcVar20[3] = ' ';
                pcVar20[4] = 'b';
                pcVar20[5] = 'e';
                pcVar20[6] = ' ';
                pcVar20[7] = '`';
                pcVar20 = (char *)(local_340 + 3);
                pcVar20[0] = 'u';
                pcVar20[1] = 'n';
                pcVar20[2] = 'i';
                pcVar20[3] = 'f';
                pcVar20[4] = 'o';
                pcVar20[5] = 'r';
                pcVar20[6] = 'm';
                pcVar20[7] = '`';
                builtin_strncpy((char *)((long)local_340 + 0x1d),"rm` vari",8);
                builtin_strncpy((char *)((long)local_340 + 0x25),"ability.",8);
                local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)local_2c8;
                *(char *)((long)local_340 + (long)local_2c8) = '\0';
                fmt::format<std::__cxx11::string>
                          ((string *)local_1b8,(fmt *)&local_340,&local_2e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2c8);
                ::std::__cxx11::string::operator=((string *)&local_318,(string *)local_1b8);
                if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
                  operator_delete((void *)local_1b8._0_8_,
                                  (ulong)(aaStack_1a8[0]._M_allocated_capacity + 1));
                }
                if (local_340 !=
                    &local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish) {
                  operator_delete(local_340,
                                  (ulong)((long)&(((Attribute *)
                                                  local_338.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish)->_name)
                                                 ._M_dataplus._M_p + 1));
                }
                goto LAB_001f9ffc;
              }
              if (p_Var18[5]._M_left != p_Var18[5]._M_parent) {
                local_320._0_4_ = 4;
                pPVar26 = (Property *)0x58;
                pcVar20 = 
                "TimeSample or corrupted value assigned to a property where `uniform` variability is set."
                ;
                goto LAB_001f9ff2;
              }
              if (p_Var18[4]._M_right == (_Base_ptr)0x0) {
                uVar21 = (Property *)0x0;
              }
              else {
                iVar11 = (**(code **)p_Var18[4]._M_right)();
                uVar21 = CONCAT71((int7)(uVar19 >> 8),iVar11 == 4);
              }
              pbVar14 = local_2f0;
              if (((char)uVar21 != '\0') || ((p_Var18[5]._M_color & _S_black) != _S_red))
              goto LAB_001f9f8b;
              if (((char)p_Var18[5]._M_color == _S_red) &&
                 (((p_Var18[4]._M_right != (_Base_ptr)0x0 &&
                   (iVar11 = (**(code **)p_Var18[4]._M_right)(), iVar11 == 0)) ||
                  ((p_Var18[4]._M_right != (_Base_ptr)0x0 &&
                   (iVar11 = (**(code **)p_Var18[4]._M_right)(), iVar11 == 1))))))
              goto LAB_001f9f87;
              this_00 = &p_Var18[4]._M_parent;
              pPVar24 = (Property *)local_1b8;
              primvar::PrimVar::get_value<std::vector<int,std::allocator<int>>>
                        ((optional<std::vector<int,_std::allocator<int>_>_> *)local_1b8,
                         (PrimVar *)this_00);
              uVar10 = aaStack_1a8[0]._8_8_;
              uVar9 = aaStack_1a8[0]._M_allocated_capacity;
              uVar8 = local_1b8._8_8_;
              if (local_1b8[0] == 1) {
                local_1b8._8_8_ = (Property *)0x0;
                aaStack_1a8[0]._M_allocated_capacity = (Property *)0x0;
                aaStack_1a8[0]._8_8_ = (_Base_ptr *)0x0;
                uVar21 = uVar9;
                this_00 = uVar10;
                pPVar24 = (Property *)uVar8;
              }
              local_340 = (pointer *)CONCAT71(local_340._1_7_,local_1b8[0]);
              pp_Var23 = (_Base_ptr *)this_00;
              pPVar25 = pPVar24;
              if (local_1b8[0] != 0) {
                pp_Var23 = (_Base_ptr *)0x0;
                pPVar25 = (Property *)0x0;
                local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)pPVar24;
                local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)uVar21;
                local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)this_00;
              }
              if ((local_1b8[0] & pPVar25 != (Property *)0x0) == 1) {
                operator_delete(pPVar25,(long)pp_Var23 - (long)pPVar25);
              }
              fVar22 = local_340._0_1_;
              if (local_340._0_1_ == (fmt)0x1) {
                nonstd::optional_lite::optional<std::vector<int,std::allocator<int>>>::operator=
                          (local_2c0,&local_338);
              }
              else {
                local_320._0_4_ = 4;
                ::std::__cxx11::string::operator=((string *)&local_318,"Internal data corrupsed.");
              }
              if ((local_340._0_1_ == (fmt)0x1) &&
                 ((Property *)
                  local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (Property *)0x0)) {
                operator_delete(local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_338.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_338.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              if (fVar22 != (fmt)0x0) goto LAB_001f9f90;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_360._M_dataplus._M_p == &local_360.field_2) goto LAB_001fa013;
            }
            else {
              local_320._0_4_ = 3;
              ::std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 0x10),"Property type mismatch. ",0x18);
              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_1b8 + 0x10),local_2e8._M_dataplus._M_p,
                                   local_2e8._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," expects type `",0xf);
              tinyusdz::value::TypeTraits<std::vector<int,std::allocator<int>>>::
              type_name_abi_cxx11_();
              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(char *)local_340,
                                   (long)local_338.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,"` but defined as type `",0x17);
              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,local_360._M_dataplus._M_p,local_360._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"`",1);
              if (local_340 !=
                  &local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
                operator_delete(local_340,
                                (ulong)((long)&(((Attribute *)
                                                local_338.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish)->_name).
                                               _M_dataplus._M_p + 1));
              }
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::operator=((string *)&local_318,(string *)&local_340);
              if (local_340 !=
                  &local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
                operator_delete(local_340,
                                (ulong)((long)&(((Attribute *)
                                                local_338.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish)->_name).
                                               _M_dataplus._M_p + 1));
              }
              ::std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
              ::std::ios_base::~ios_base(local_138);
LAB_001f9ffc:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_360._M_dataplus._M_p == &local_360.field_2) goto LAB_001fa013;
            }
            operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
          }
LAB_001fa013:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
          }
          if (local_280 != local_270) {
            operator_delete(local_280,local_270[0] + 1);
          }
          iVar11 = 0;
          if (((ulong)local_320 & 0xfffffffd) == 0) {
            iVar11 = 3;
LAB_001fa280:
            bVar28 = false;
          }
          else {
            bVar28 = true;
            if (local_320._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
              poVar12 = (ostream *)::std::ostream::operator<<((Property *)local_1b8,0xbd4);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
              local_340 = &local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_340,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char_const*,std::__cxx11::string>
                        (&local_360,(fmt *)&local_340,(string *)local_260,&local_318._M_p,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar26);
              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b8,local_360._M_dataplus._M_p,
                                   local_360._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
              paVar2 = &local_360.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_360._M_dataplus._M_p != paVar2) {
                operator_delete(local_360._M_dataplus._M_p,
                                local_360.field_2._M_allocated_capacity + 1);
              }
              psVar6 = local_2f8;
              if (local_340 !=
                  &local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
                operator_delete(local_340,
                                (ulong)((long)&(((Attribute *)
                                                local_338.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish)->_name).
                                               _M_dataplus._M_p + 1));
              }
              if (psVar6 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar13 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)&local_340,(ulong)(psVar6->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar13 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar13 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_360.field_2._M_allocated_capacity = *psVar1;
                  local_360.field_2._8_8_ = plVar13[3];
                  local_360._M_dataplus._M_p = (pointer)paVar2;
                }
                else {
                  local_360.field_2._M_allocated_capacity = *psVar1;
                  local_360._M_dataplus._M_p = (pointer)*plVar13;
                }
                local_360._M_string_length = plVar13[1];
                *plVar13 = (long)psVar1;
                plVar13[1] = 0;
                *(undefined1 *)(plVar13 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)psVar6,(string *)&local_360);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_360._M_dataplus._M_p != paVar2) {
                  operator_delete(local_360._M_dataplus._M_p,
                                  local_360.field_2._M_allocated_capacity + 1);
                }
                if (local_340 !=
                    &local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish) {
                  operator_delete(local_340,
                                  (ulong)((long)&(((Attribute *)
                                                  local_338.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish)->_name)
                                                 ._M_dataplus._M_p + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
              ::std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x70));
              iVar11 = 1;
              goto LAB_001fa280;
            }
          }
          if (local_318._M_p != local_310 + 8) {
            operator_delete(local_318._M_p,local_310._8_8_ + 1);
          }
          if (bVar28) {
            p_Var4 = p_Var18 + 1;
            cVar15 = ::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_1e8,(key_type *)p_Var4);
            if ((_Rb_tree_header *)cVar15._M_node == &local_1e8._M_impl.super__Rb_tree_header) {
              pmVar16 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        ::operator[](local_2a8,(key_type *)p_Var4);
              ::std::__cxx11::string::_M_assign((string *)pmVar16);
              (pmVar16->_attrib)._varying_authored = (bool)p_Var18[3].field_0x4;
              (pmVar16->_attrib)._variability = p_Var18[3]._M_color;
              ::std::__cxx11::string::_M_assign((string *)&(pmVar16->_attrib)._type_name);
              linb::any::operator=((any *)&(pmVar16->_attrib)._var,(any *)&p_Var18[4]._M_parent);
              (pmVar16->_attrib)._var._blocked = SUB41(p_Var18[5]._M_color,0);
              ::std::
              vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)&(pmVar16->_attrib)._var._ts,
                          (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)&p_Var18[5]._M_parent);
              (pmVar16->_attrib)._var._ts._dirty = SUB41(p_Var18[6]._M_color,0);
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        (&(pmVar16->_attrib)._paths,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &p_Var18[6]._M_parent);
              AttrMetas::operator=(&(pmVar16->_attrib)._metas,(AttrMetas *)(p_Var18 + 7));
              *(_Base_ptr *)&pmVar16->_listOpQual = p_Var18[0x17]._M_parent;
              (pmVar16->_rel).type = *(Type *)&p_Var18[0x17]._M_left;
              Path::operator=(&(pmVar16->_rel).targetPath,(Path *)&p_Var18[0x17]._M_right);
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        (&(pmVar16->_rel).targetPathVector,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &p_Var18[0x1e]._M_parent);
              (pmVar16->_rel).listOpQual = p_Var18[0x1f]._M_color;
              AttrMetas::operator=(&(pmVar16->_rel)._metas,(AttrMetas *)&p_Var18[0x1f]._M_parent);
              (pmVar16->_rel)._varying_authored = *(bool *)&p_Var18[0x2f]._M_left;
              ::std::__cxx11::string::_M_assign((string *)&pmVar16->_prop_value_type_name);
              pmVar16->_has_custom = *(bool *)&p_Var18[0x30]._M_right;
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_1e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var4
                        );
            }
            cVar15 = ::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_1e8,(key_type *)p_Var4);
            iVar11 = 0;
            if ((_Rb_tree_header *)cVar15._M_node == &local_1e8._M_impl.super__Rb_tree_header) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
              poVar12 = (ostream *)::std::ostream::operator<<((Property *)local_1b8,0xbd6);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_320,"Unsupported/unimplemented property: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               p_Var4);
              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b8,(char *)local_320,(long)local_318._M_p);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
              if (local_320 != (undefined1  [8])local_310) {
                operator_delete((void *)local_320,(ulong)(local_310._0_8_ + 1));
              }
              psVar6 = local_2f8;
              if (local_2f8 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar17 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)&local_360,(ulong)(psVar6->_M_dataplus)._M_p);
                plVar13 = plVar17 + 2;
                if ((long *)*plVar17 == plVar13) {
                  local_310._0_8_ = *plVar13;
                  local_310._8_8_ = plVar17[3];
                  local_320 = (undefined1  [8])local_310;
                }
                else {
                  local_310._0_8_ = *plVar13;
                  local_320 = (undefined1  [8])*plVar17;
                }
                local_318._M_p = (pointer)plVar17[1];
                *plVar17 = (long)plVar13;
                plVar17[1] = 0;
                *(undefined1 *)(plVar17 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)psVar6,(string *)local_320);
                if (local_320 != (undefined1  [8])local_310) {
                  operator_delete((void *)local_320,(ulong)(local_310._0_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_360._M_dataplus._M_p != &local_360.field_2) {
                  operator_delete(local_360._M_dataplus._M_p,
                                  local_360.field_2._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
              ::std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x70));
              iVar11 = 1;
            }
          }
        }
      }
      if ((iVar11 != 3) && (iVar11 != 0)) break;
      p_Var18 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var18);
      bVar27 = p_Var18 == local_288;
    } while (!(bool)bVar27);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_1e8,(_Link_type)local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent);
  return (bool)(bVar27 & 1);
}

Assistant:

bool ReconstructPrim<BlendShape>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    BlendShape *bs,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  (void)spec;
  (void)warn;
  (void)references;
  (void)options;

  DCOUT("Reconstruct BlendShape");

  constexpr auto kOffsets = "offsets";
  constexpr auto kNormalOffsets = "normalOffsets";
  constexpr auto kPointIndices = "pointIndices";

  std::set<std::string> table;
  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, kOffsets, BlendShape, bs->offsets)
    PARSE_TYPED_ATTRIBUTE(table, prop, kNormalOffsets, BlendShape, bs->normalOffsets)
    PARSE_TYPED_ATTRIBUTE(table, prop, kPointIndices, BlendShape, bs->pointIndices)
    ADD_PROPERTY(table, prop, Skeleton, bs->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

#if 0 // TODO: Check required properties exist in strict mode.
  // `offsets` and `normalOffsets` are required property
  if (!table.count(kOffsets)) {
    PUSH_ERROR_AND_RETURN("`offsets` property is missing. `uniform vector3f[] offsets` is a required property.");
  }
  if (!table.count(kNormalOffsets)) {
    PUSH_ERROR_AND_RETURN("`normalOffsets` property is missing. `uniform vector3f[] normalOffsets` is a required property.");
  }
#endif

  return true;
}